

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

void __thiscall QXmlStreamWriter::writeComment(QXmlStreamWriter *this,QAnyStringView text)

{
  _Head_base<0UL,_QXmlStreamWriterPrivate_*,_false> this_00;
  bool bVar1;
  size_t in_RCX;
  
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QXmlStreamWriterPrivate,_std::default_delete<QXmlStreamWriterPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QXmlStreamWriterPrivate_*,_std::default_delete<QXmlStreamWriterPrivate>_>
       .super__Head_base<0UL,_QXmlStreamWriterPrivate_*,_false>._M_head_impl;
  bVar1 = QXmlStreamWriterPrivate::finishStartElement(this_00._M_head_impl,false);
  if ((!bVar1) && (((this_00._M_head_impl)->field_0x78 & 0x80) != 0)) {
    QXmlStreamWriterPrivate::indent
              (this_00._M_head_impl,
               *(int *)((long)&(this_00._M_head_impl)->super_QXmlStreamPrivateTagStack + 0x50) + 1);
  }
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x57d1c4,(void *)0x4,in_RCX);
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,text.field_0._0_4_,(void *)text.m_size,in_RCX)
  ;
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x57d1c9,(void *)0x3,in_RCX);
  (this_00._M_head_impl)->field_0x78 = (this_00._M_head_impl)->field_0x78 & 0xf5;
  return;
}

Assistant:

void QXmlStreamWriter::writeComment(QAnyStringView text)
{
    Q_D(QXmlStreamWriter);
    Q_ASSERT(!contains(text, "--"_L1) && !endsWith(text, '-'));
    if (!d->finishStartElement(false) && d->autoFormatting)
        d->indent(d->tagStack.size());
    d->write("<!--");
    d->write(text);
    d->write("-->");
    d->inStartElement = d->lastWasStartElement = false;
}